

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O2

bool __thiscall
rlottie::internal::renderer::Group::resolveKeyPath
          (Group *this,LOTKeyPath *keyPath,uint32_t depth,LOTVariant *value)

{
  Property PVar1;
  pointer ppOVar2;
  bool bVar3;
  uint32_t uVar4;
  char *pcVar5;
  FilterData *this_00;
  Group *pGVar6;
  Object **child;
  pointer ppOVar7;
  allocator local_b9;
  FilterBase<rlottie::internal::model::Group> *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar5 = name(this);
  std::__cxx11::string::string((string *)&local_b0,pcVar5,&local_b9);
  bVar3 = std::operator==(&local_b0,"__");
  std::__cxx11::string::_M_dispose();
  if (!bVar3) {
    pGVar6 = (this->mModel).super_FilterBase<rlottie::internal::model::Group>.model_;
    if ((undefined1  [16])
        ((undefined1  [16])(pGVar6->super_Object).field_0 & (undefined1  [16])0x400000000000000) ==
        (undefined1  [16])0x0) {
      pGVar6 = (Group *)(pGVar6->super_Object).field_0.mPtr;
    }
    std::__cxx11::string::string((string *)&local_b0,(char *)pGVar6,&local_b9);
    bVar3 = LOTKeyPath::matches(keyPath,&local_b0,depth);
    std::__cxx11::string::_M_dispose();
    if (!bVar3) {
      return false;
    }
    local_b8 = &(this->mModel).super_FilterBase<rlottie::internal::model::Group>;
    pGVar6 = (((Filter<rlottie::internal::model::Group> *)local_b8)->
             super_FilterBase<rlottie::internal::model::Group>).model_;
    if ((undefined1  [16])
        ((undefined1  [16])(pGVar6->super_Object).field_0 & (undefined1  [16])0x400000000000000) ==
        (undefined1  [16])0x0) {
      pGVar6 = (Group *)(pGVar6->super_Object).field_0.mPtr;
    }
    std::__cxx11::string::string((string *)&local_b0,(char *)pGVar6,&local_b9);
    bVar3 = std::operator==(&local_b0,"__");
    std::__cxx11::string::_M_dispose();
    if (!bVar3) {
      pGVar6 = ((FilterBase<rlottie::internal::model::Group> *)&local_b8->model_)->model_;
      if ((undefined1  [16])
          ((undefined1  [16])(pGVar6->super_Object).field_0 & (undefined1  [16])0x400000000000000)
          == (undefined1  [16])0x0) {
        pGVar6 = (Group *)(pGVar6->super_Object).field_0.mPtr;
      }
      std::__cxx11::string::string((string *)&local_90,(char *)pGVar6,(allocator *)&local_b0);
      bVar3 = LOTKeyPath::fullyResolvesTo(keyPath,&local_90,depth);
      if (bVar3) {
        PVar1 = value->mPropery;
        std::__cxx11::string::_M_dispose();
        if (PVar1 - TrAnchor < 5) {
          this_00 = model::FilterBase<rlottie::internal::model::Group>::filter(local_b8);
          model::FilterData::addValue(this_00,value);
        }
      }
      else {
        std::__cxx11::string::_M_dispose();
      }
    }
  }
  pcVar5 = name(this);
  std::__cxx11::string::string((string *)&local_50,pcVar5,(allocator *)&local_b0);
  bVar3 = LOTKeyPath::propagate(keyPath,&local_50,depth);
  std::__cxx11::string::_M_dispose();
  if (bVar3) {
    pcVar5 = name(this);
    std::__cxx11::string::string((string *)&local_70,pcVar5,(allocator *)&local_b0);
    uVar4 = LOTKeyPath::nextDepth(keyPath,&local_70,depth);
    std::__cxx11::string::_M_dispose();
    ppOVar2 = (this->mContents).
              super__Vector_base<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppOVar7 = (this->mContents).
                   super__Vector_base<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppOVar7 != ppOVar2;
        ppOVar7 = ppOVar7 + 1) {
      (*(*ppOVar7)->_vptr_Object[4])(*ppOVar7,keyPath,(ulong)uVar4,value);
    }
  }
  return true;
}

Assistant:

bool renderer::Group::resolveKeyPath(LOTKeyPath &keyPath, uint32_t depth,
                                     LOTVariant &value)
{
    if (!keyPath.skip(name())) {
        if (!keyPath.matches(mModel.name(), depth)) {
            return false;
        }

        if (!keyPath.skip(mModel.name())) {
            if (keyPath.fullyResolvesTo(mModel.name(), depth) &&
                transformProp(value.property())) {
                mModel.filter()->addValue(value);
            }
        }
    }

    if (keyPath.propagate(name(), depth)) {
        uint32_t newDepth = keyPath.nextDepth(name(), depth);
        for (auto &child : mContents) {
            child->resolveKeyPath(keyPath, newDepth, value);
        }
    }
    return true;
}